

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxVectorBuiltin::Resolve(FxVectorBuiltin *this,FCompileContext *ctx)

{
  FxExpression *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  PFloat **ppPVar3;
  
  if (this->Self != (FxExpression *)0x0) {
    iVar2 = (*this->Self->_vptr_FxExpression[2])();
    this->Self = (FxExpression *)CONCAT44(extraout_var,iVar2);
  }
  pFVar1 = this->Self;
  if (pFVar1 == (FxExpression *)0x0) {
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxVectorBuiltin *)0x0;
  }
  else {
    if (((PStruct *)pFVar1->ValueType != TypeVector2) &&
       ((PStruct *)pFVar1->ValueType != TypeVector3)) {
      __assert_fail("Self->IsVector()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x2039,"virtual FxExpression *FxVectorBuiltin::Resolve(FCompileContext &)");
    }
    if ((this->Function).Index == 0x279) {
      ppPVar3 = &TypeFloat64;
    }
    else {
      ppPVar3 = (PFloat **)&pFVar1->ValueType;
    }
    (this->super_FxExpression).ValueType = (PType *)*ppPVar3;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxVectorBuiltin::Resolve(FCompileContext &ctx)
{
	SAFE_RESOLVE(Self, ctx);
	assert(Self->IsVector());	// should never be created for anything else.
	ValueType = Function == NAME_Length ? TypeFloat64 : Self->ValueType;
	return this;
}